

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_scan.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e9e2::
ARTScanTest_scanRangeReverseTwoLeaves_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTScanTest_scanRangeReverseTwoLeaves_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  anon_class_16_2_811f47a5 fn_00;
  value_view v;
  value_view v_00;
  bool bVar1;
  const_reference pvVar2;
  char *pcVar3;
  reference pvVar4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  anon_class_16_2_811f47a5 fn;
  vector<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  visited;
  uint64_t n;
  TypeParam *db;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  AssertHelper local_628;
  Message local_620;
  int local_614;
  AssertionResult local_610;
  AssertHelper local_600;
  Message local_5f8;
  int local_5ec;
  EqHelper local_5e8 [7];
  bool in_stack_fffffffffffffa1f;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_fffffffffffffa20;
  AssertHelper local_5d8;
  Message local_5d0;
  size_type local_5c8;
  int local_5bc;
  AssertionResult local_5b8;
  AssertHelper local_5a8;
  Message local_5a0;
  int local_594;
  AssertionResult local_590;
  uint64_t *local_580;
  vector<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  *pvStack_578;
  uint64_t *local_570;
  vector<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  *pvStack_568;
  vector<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  local_560;
  uint64_t local_548;
  pointer local_540;
  size_t sStack_538;
  pointer local_520;
  size_t sStack_518;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *local_508;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)in_stack_fffffffffffffa20._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,in_stack_fffffffffffffa1f);
  local_508 = unodb::test::
              tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              ::get_db(&local_500);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_520 = pvVar2->_M_ptr;
  sStack_518 = (pvVar2->_M_extent)._M_extent_value;
  v._M_ptr = pvVar2->_M_ptr;
  v._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>(&local_500,1,v,false);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_540 = pvVar2->_M_ptr;
  sStack_538 = (pvVar2->_M_extent)._M_extent_value;
  v_00._M_ptr = pvVar2->_M_ptr;
  v_00._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>(&local_500,2,v_00,false);
  local_548 = 0;
  local_560.
  super__Vector_base<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_560.
  super__Vector_base<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_560.
  super__Vector_base<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  ::vector(&local_560);
  local_580 = &local_548;
  fn_00.visited = &local_560;
  fn_00.n = local_580;
  pvStack_578 = &local_560;
  local_570 = local_580;
  pvStack_568 = &local_560;
  unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
  scan_range<(anonymous_namespace)::ARTScanTest_scanRangeReverseTwoLeaves_Test<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::TestBody()::_lambda(unodb::visitor<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator>const&)_1_>
            ((olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *)local_508,2,
             0,fn_00);
  local_594 = 2;
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)&local_590,"(2)","(n)",&local_594,&local_548);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_590);
  if (!bVar1) {
    testing::Message::Message(&local_5a0);
    pcVar3 = testing::AssertionResult::failure_message(&local_590);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0x2cd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    testing::Message::~Message(&local_5a0);
  }
  testing::AssertionResult::~AssertionResult(&local_590);
  local_5bc = 2;
  local_5c8 = std::
              vector<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
              ::size(&local_560);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)&local_5b8,"(2)","(visited.size())",&local_5bc,&local_5c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5b8);
  if (!bVar1) {
    testing::Message::Message(&local_5d0);
    pcVar3 = testing::AssertionResult::failure_message(&local_5b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_5d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0x2ce,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5d8,&local_5d0);
    testing::internal::AssertHelper::~AssertHelper(&local_5d8);
    testing::Message::~Message(&local_5d0);
  }
  testing::AssertionResult::~AssertionResult(&local_5b8);
  local_5ec = 2;
  pvVar4 = std::
           vector<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
           ::operator[](&local_560,0);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            (local_5e8,"(2)","(visited[0].first)",&local_5ec,&pvVar4->first);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e8);
  if (!bVar1) {
    testing::Message::Message(&local_5f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0x2cf,pcVar3);
    testing::internal::AssertHelper::operator=(&local_600,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper(&local_600);
    testing::Message::~Message(&local_5f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8);
  local_614 = 1;
  pvVar4 = std::
           vector<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
           ::operator[](&local_560,1);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)&local_610,"(1)","(visited[1].first)",&local_614,&pvVar4->first);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_610);
  if (!bVar1) {
    testing::Message::Message(&local_620);
    pcVar3 = testing::AssertionResult::failure_message(&local_610);
    testing::internal::AssertHelper::AssertHelper
              (&local_628,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0x2d0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_628,&local_620);
    testing::internal::AssertHelper::~AssertHelper(&local_628);
    testing::Message::~Message(&local_620);
  }
  testing::AssertionResult::~AssertionResult(&local_610);
  std::
  vector<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  ::~vector(&local_560);
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier(&local_500);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTScanTest, scanRangeReverseTwoLeaves) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(1, unodb::test::test_values[0]);
  verifier.insert(2, unodb::test::test_values[1]);
  uint64_t n = 0;
  std::vector<std::pair<std::uint64_t, typename TypeParam::value_view>>
      visited{};
  auto fn = [&n,
             &visited](const unodb::visitor<typename TypeParam::iterator>& v) {
    n++;
    visited.emplace_back(decode(v.get_key()), v.get_value());
    return false;
  };
  db.scan_range(2, 0, fn);
  UNODB_EXPECT_EQ(2, n);
  UNODB_EXPECT_EQ(2, visited.size());
  UNODB_EXPECT_EQ(2, visited[0].first);  // make sure visited in reverse order.
  UNODB_EXPECT_EQ(1, visited[1].first);
}